

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

void mock_assert(int result,char *expression,char *file,int line)

{
  if (result != 0) {
    return;
  }
  if (global_expecting_assert == 0) {
    cm_print_error("ASSERT: %s\n");
    _fail(file,line);
  }
  global_last_failed_assert = expression;
  longjmp((__jmp_buf_tag *)global_expect_assert_env,0);
}

Assistant:

void mock_assert(const int result, const char* const expression,
                 const char* const file, const int line) {
    if (!result) {
        if (global_expecting_assert) {
            global_last_failed_assert = expression;
            longjmp(global_expect_assert_env, result);
        } else {
            cm_print_error("ASSERT: %s\n", expression);
            _fail(file, line);
        }
    }
}